

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool __thiscall
cfd::core::KeyFormatData::IsFindFormatType(KeyFormatData *this,Bip32FormatType format_type)

{
  Bip32FormatType format_type_local;
  KeyFormatData *this_local;
  
  if (format_type < (kBip84|kBip49)) {
    this_local._7_1_ =
         ::std::vector<bool,_std::allocator<bool>_>::operator[]
                   (&this->has_format_,(ulong)format_type);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool KeyFormatData::IsFindFormatType(Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
    case kBip49:
    case kBip84:
      return (has_format_[format_type]);
    default:
      return false;
  }
}